

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_22477::
ARTIteratorTest_I4AndTwoLeavesForwardScan_Test<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_I4AndTwoLeavesForwardScan_Test<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  __extent_storage<18446744073709551615UL> *tree;
  pointer *this_00;
  undefined8 uVar1;
  iter_difference_t<const_std::byte_*> __d1;
  long lVar2;
  char *pcVar3;
  char *expected_predicate_value;
  pointer *__ptr_3;
  pointer *__ptr;
  bool bVar4;
  key_view kVar5;
  value_view vVar6;
  value_view v;
  value_view v_00;
  undefined1 local_2b0 [8];
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  iterator b;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  AssertionResult gtest_ar_;
  AssertHelper local_28;
  
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *)local_2b0,false);
  kVar5 = unodb::test::
          tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_2b0,0);
  v._M_extent._M_extent_value = 1;
  v._M_ptr = &unodb::test::test_value_1;
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)local_2b0,kVar5,v,false);
  kVar5 = unodb::test::
          tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_2b0,1);
  expected_predicate_value = (char *)0x0;
  v_00._M_extent._M_extent_value = 2;
  v_00._M_ptr = &unodb::test::test_value_2;
  unodb::test::
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal((tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)local_2b0,kVar5,v_00,false);
  tree = &verifier.unused_key._M_extent;
  this_00 = &verifier.key_views.
             super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator
            ((iterator *)this_00,
             (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)tree);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::first((iterator *)this_00);
  local_40._M_head_impl._0_1_ =
       b.stack_.c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node !=
       (_Map_pointer)
       b.stack_.c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_map_size;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (b.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node ==
      (_Map_pointer)
      b.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&b.keybuf_.off,(internal *)&local_40,(AssertionResult *)"b.valid()","false"
               ,"true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x58,(char *)CONCAT71(b.keybuf_.off._1_7_,(char)b.keybuf_.off));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT71(b.keybuf_.off._1_7_,(char)b.keybuf_.off) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(b.keybuf_.off._1_7_,(char)b.keybuf_.off),
                      (long)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 1);
    }
    if ((long *)CONCAT44(local_28.data_._4_4_,local_28.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_28.data_._4_4_,local_28.data_._0_4_) + 8))();
    }
  }
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  kVar5 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_key((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar1 = *(undefined8 *)kVar5._M_ptr;
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
        (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
       uVar1 << 0x38);
  local_28.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&b.keybuf_.off,"(decode(b.get_key()))","(0)",(unsigned_long *)&local_40,
             (int *)&local_28);
  if ((char)b.keybuf_.off == '\0') {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x5a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  vVar6 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_val((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (vVar6._M_extent._M_extent_value._M_extent_value == 1) {
    bVar4 = *vVar6._M_ptr == 0;
  }
  else {
    bVar4 = false;
  }
  local_40._M_head_impl._0_1_ = bVar4;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (bVar4 == false) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&b.keybuf_.off,(internal *)&local_40,
               (AssertionResult *)"std::ranges::equal(b.get_val(), unodb::test::test_values[0])",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x5c,(char *)CONCAT71(b.keybuf_.off._1_7_,(char)b.keybuf_.off));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT71(b.keybuf_.off._1_7_,(char)b.keybuf_.off) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(b.keybuf_.off._1_7_,(char)b.keybuf_.off),
                      (long)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 1);
    }
    if ((long *)CONCAT44(local_28.data_._4_4_,local_28.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_28.data_._4_4_,local_28.data_._0_4_) + 8))();
    }
  }
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::next((iterator *)
                   &verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_40._M_head_impl._0_1_ =
       b.stack_.c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node !=
       (_Map_pointer)
       b.stack_.c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_map_size;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (b.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node ==
      (_Map_pointer)
      b.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&b.keybuf_.off,(internal *)&local_40,(AssertionResult *)"b.valid()","false"
               ,"true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x5f,(char *)CONCAT71(b.keybuf_.off._1_7_,(char)b.keybuf_.off));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT71(b.keybuf_.off._1_7_,(char)b.keybuf_.off) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(b.keybuf_.off._1_7_,(char)b.keybuf_.off),
                      (long)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 1);
    }
    if ((long *)CONCAT44(local_28.data_._4_4_,local_28.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_28.data_._4_4_,local_28.data_._0_4_) + 8))();
    }
  }
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  kVar5 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_key((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar1 = *(undefined8 *)kVar5._M_ptr;
  local_40._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
        (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
       uVar1 << 0x38);
  local_28.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&b.keybuf_.off,"(decode(b.get_key()))","(1)",(unsigned_long *)&local_40,
             (int *)&local_28);
  if ((char)b.keybuf_.off == '\0') {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x61,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  vVar6 = unodb::
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_val((iterator *)
                              &verifier.key_views.
                               super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (vVar6._M_extent._M_extent_value._M_extent_value == 2) {
    lVar2 = 0;
    do {
      if (vVar6._M_ptr[lVar2] != (&unodb::test::test_value_2)[lVar2]) goto LAB_0012e7eb;
      lVar2 = lVar2 + 1;
      bVar4 = lVar2 == 2;
    } while (!bVar4);
  }
  else {
LAB_0012e7eb:
    bVar4 = false;
  }
  local_40._M_head_impl._0_1_ = bVar4;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (bVar4 == false) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&b.keybuf_.off,(internal *)&local_40,
               (AssertionResult *)"std::ranges::equal(b.get_val(), unodb::test::test_values[1])",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,99,(char *)CONCAT71(b.keybuf_.off._1_7_,(char)b.keybuf_.off));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT71(b.keybuf_.off._1_7_,(char)b.keybuf_.off) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(b.keybuf_.off._1_7_,(char)b.keybuf_.off),
                      (long)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 1);
    }
    if ((long *)CONCAT44(local_28.data_._4_4_,local_28.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_28.data_._4_4_,local_28.data_._0_4_) + 8))();
    }
  }
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::next((iterator *)
                   &verifier.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_40._M_head_impl._0_1_ =
       b.stack_.c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node ==
       (_Map_pointer)
       b.stack_.c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_map_size;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (b.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node !=
      (_Map_pointer)
      b.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&b.keybuf_.off,(internal *)&local_40,(AssertionResult *)"b.valid()","true",
               "false",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x66,(char *)CONCAT71(b.keybuf_.off._1_7_,(char)b.keybuf_.off));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT71(b.keybuf_.off._1_7_,(char)b.keybuf_.off) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(b.keybuf_.off._1_7_,(char)b.keybuf_.off),
                      (long)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 1);
    }
    if ((long *)CONCAT44(local_28.data_._4_4_,local_28.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_28.data_._4_4_,local_28.data_._0_4_) + 8))();
    }
  }
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  if ((byte *)0x100 < b.keybuf_.buf) {
    free((void *)b.keybuf_.ibuf._248_8_);
  }
  std::
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  *)&b);
  if (verifier._192_8_ != 0) {
    operator_delete((void *)verifier._192_8_,
                    (long)verifier.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - verifier._192_8_);
  }
  std::
  _Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               *)&verifier.test_db.key_prefix_splits);
  unodb::
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::~db((db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
         *)tree);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, I4AndTwoLeavesForwardScan) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(0, unodb::test::test_values[0]);
  verifier.insert(1, unodb::test::test_values[1]);
  auto b = db.test_only_iterator();
  b.first();  // obtain iterator.
  UNODB_EXPECT_TRUE(b.valid());
  {
    UNODB_EXPECT_EQ(decode(b.get_key()), 0);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(b.get_val(), unodb::test::test_values[0]));
  }
  b.next();  // advance
  UNODB_EXPECT_TRUE(b.valid());
  {
    UNODB_EXPECT_EQ(decode(b.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(b.get_val(), unodb::test::test_values[1]));
  }
  b.next();                       // advance.
  UNODB_EXPECT_FALSE(b.valid());  // nothing more in the iterator.
}